

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucheventhandle.cpp
# Opt level: O0

bool __thiscall TouchEventHandle::onHandleEvent(TouchEventHandle *this,Event *e)

{
  EventType EVar1;
  ostream *this_00;
  Event *e_local;
  TouchEventHandle *this_local;
  
  if (e == (Event *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    EVar1 = Event::getType(e);
    if (EVar1 == TYPE_TOUCH) {
      this_00 = std::operator<<((ostream *)&std::cout,"[TOUCH] handling touch event");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = EventHandle::onHandleEvent(&this->super_EventHandle,e);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TouchEventHandle::onHandleEvent(Event* e)
{
	if (!e)
		return false;

	switch (e->getType()) {
	case Event::TYPE_TOUCH:
		cout<<"[TOUCH] handling touch event"<<endl;
		return true;
	default:
		break;
	}

	return EventHandle::onHandleEvent(e);
}